

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O1

ostream * CLI::detail::format_help(ostream *out,string *name,string *description,size_t wid)

{
  char cVar1;
  long lVar2;
  size_type sVar3;
  pointer pcVar4;
  long lVar5;
  size_type sVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  ::std::operator+(&local_50,"  ",name);
  ::std::__cxx11::string::operator=((string *)name,(string *)&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  lVar2 = *(long *)out;
  lVar5 = (long)(int)wid;
  *(long *)(out + *(long *)(lVar2 + -0x18) + 0x10) = lVar5;
  lVar2 = *(long *)(lVar2 + -0x18);
  *(uint *)(out + lVar2 + 0x18) = *(uint *)(out + lVar2 + 0x18) & 0xffffff4f | 0x20;
  ::std::__ostream_insert<char,std::char_traits<char>>
            (out,(name->_M_dataplus)._M_p,name->_M_string_length);
  if (description->_M_string_length != 0) {
    if (wid <= name->_M_string_length) {
      ::std::__ostream_insert<char,std::char_traits<char>>(out,"\n",1);
      *(long *)(out + *(long *)(*(long *)out + -0x18) + 0x10) = lVar5;
      ::std::__ostream_insert<char,std::char_traits<char>>(out,"",0);
    }
    sVar3 = description->_M_string_length;
    if (sVar3 != 0) {
      pcVar4 = (description->_M_dataplus)._M_p;
      sVar6 = 0;
      do {
        cVar1 = pcVar4[sVar6];
        ::std::ostream::put((char)out);
        if (cVar1 == '\n') {
          *(long *)(out + *(long *)(*(long *)out + -0x18) + 0x10) = lVar5;
          ::std::__ostream_insert<char,std::char_traits<char>>(out,"",0);
        }
        sVar6 = sVar6 + 1;
      } while (sVar3 != sVar6);
    }
  }
  ::std::__ostream_insert<char,std::char_traits<char>>(out,"\n",1);
  return out;
}

Assistant:

inline std::ostream &format_help(std::ostream &out, std::string name, std::string description, size_t wid) {
    name = "  " + name;
    out << std::setw(static_cast<int>(wid)) << std::left << name;
    if(!description.empty()) {
        if(name.length() >= wid)
            out << "\n" << std::setw(static_cast<int>(wid)) << "";
        for(const char c : description) {
            out.put(c);
            if(c == '\n') {
                out << std::setw(static_cast<int>(wid)) << "";
            }
        }
    }
    out << "\n";
    return out;
}